

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

SstStream CP_newStream(void)

{
  char *pcVar1;
  SstStream __s;
  char *DPEnvValue;
  char *CPEnvValue;
  SstStream Stream;
  char *local_18;
  char *local_10;
  
  __s = (SstStream)malloc(0x310);
  local_18 = (char *)0x0;
  memset(__s,0,0x310);
  pthread_mutex_init((pthread_mutex_t *)&__s->DataLock,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&__s->DataCondition,(pthread_condattr_t *)0x0);
  __s->WriterTimestep = -1;
  __s->ReaderTimestep = -1;
  __s->CloseTimestepCount = 0xffffffffffffffff;
  __s->LastDemandTimestep = 0xffffffffffffffff;
  __s->LastReleasedTimestep = -1;
  __s->DiscardPriorTimestep = -1;
  __s->CPVerbosityLevel = 1;
  __s->DPVerbosityLevel = 1;
  local_10 = getenv("SstVerbose");
  pcVar1 = local_10;
  if (local_10 == (char *)0x0) {
    local_10 = getenv("SstCPVerbose");
    pcVar1 = local_18;
  }
  local_18 = pcVar1;
  if (local_10 != (char *)0x0) {
    __isoc99_sscanf(local_10,"%d",&__s->CPVerbosityLevel);
  }
  if (local_18 != (char *)0x0) {
    __isoc99_sscanf(local_18,"%d",&__s->DPVerbosityLevel);
  }
  return __s;
}

Assistant:

SstStream CP_newStream()
{
    SstStream Stream = malloc(sizeof(*Stream));
    char *CPEnvValue = NULL;
    char *DPEnvValue = NULL;
    memset(Stream, 0, sizeof(*Stream));
    pthread_mutex_init(&Stream->DataLock, NULL);
    pthread_cond_init(&Stream->DataCondition, NULL);
    Stream->WriterTimestep = -1; // Filled in by ProvideTimestep
    Stream->ReaderTimestep = -1; // first beginstep will get us timestep 0
    Stream->CloseTimestepCount = (size_t)-1;
    Stream->LastDemandTimestep = (size_t)-1;
    Stream->LastReleasedTimestep = -1;
    Stream->DiscardPriorTimestep = -1; // Timesteps prior to this discarded/released upon arrival
    Stream->CPVerbosityLevel = CriticalVerbose;
    Stream->DPVerbosityLevel = CriticalVerbose;
    if ((CPEnvValue = getenv("SstVerbose")))
    {
        DPEnvValue = CPEnvValue;
    }
    else
    {
        CPEnvValue = getenv("SstCPVerbose");
    }
    if (CPEnvValue)
    {
        sscanf(CPEnvValue, "%d", &Stream->CPVerbosityLevel);
    }
    if (DPEnvValue)
    {
        sscanf(DPEnvValue, "%d", &Stream->DPVerbosityLevel);
    }
    return Stream;
}